

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeoIP.c
# Opt level: O2

GeoIPRegion * GeoIP_region_by_ipnum_v6(GeoIP *gi,geoipv6_t ipnum)

{
  GeoIPRegion *region;
  
  if ((byte)(gi->databaseType | 4U) != 7) {
    printf("Invalid database type %s, expected %s\n",GeoIPDBDescription[gi->databaseType],
           GeoIPDBDescription[3]);
    return (GeoIPRegion *)0x0;
  }
  region = (GeoIPRegion *)malloc(6);
  if (region != (GeoIPRegion *)0x0) {
    GeoIP_assign_region_by_inetaddr_v6(gi,ipnum,region);
  }
  return region;
}

Assistant:

GeoIPRegion * GeoIP_region_by_ipnum_v6 (GeoIP* gi, geoipv6_t ipnum) {
       if (gi->databaseType != GEOIP_REGION_EDITION_REV0 &&
                       gi->databaseType != GEOIP_REGION_EDITION_REV1) {
               printf("Invalid database type %s, expected %s\n", GeoIPDBDescription[(int)gi->databaseType], GeoIPDBDescription[GEOIP_REGION_EDITION_REV1]);
               return 0;
       }
       return _get_region_v6(gi, ipnum);
}